

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

uintmax_t fs_space_capacity(string_view path)

{
  path *this;
  string_view path_00;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  error_code ec;
  space_info s;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  error_code local_68;
  undefined1 local_58 [64];
  
  local_68._M_value = 0;
  local_78._M_len = in_RDI;
  local_78._M_str = in_RSI;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  this = (path *)(local_58 + 0x18);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (this,&local_78,auto_format);
  std::filesystem::space((path *)local_58,(error_code *)this);
  std::filesystem::__cxx11::path::~path(this);
  if (local_68._M_value != 0) {
    path_00._M_str = local_78._M_str;
    path_00._M_len = local_78._M_len;
    fname._M_str = "fs_space_capacity";
    fname._M_len = 0x11;
    fs_print_error(path_00,fname,&local_68);
    local_58._0_8_ = (pointer)0x0;
  }
  return local_58._0_8_;
}

Assistant:

std::uintmax_t fs_space_capacity(std::string_view path)
{
  // filesystem space capacity for device holding path
  // total size of the filesystem, in bytes
  // This is the quantity available to the non-priviliged user,
  // not the total physical disk size.

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::space(path, ec); !ec)  FFS_LIKELY
    return s.capacity;
#elif defined(_WIN32)
  if(ULARGE_INTEGER b;
      GetDiskFreeSpaceExA(path.data(), nullptr, &b, nullptr) != 0)  FFS_LIKELY
    return b.QuadPart;
#elif defined(HAVE_STATVFS)
  struct statvfs stat;
  if (!statvfs(path.data(), &stat))  FFS_LIKELY
    return (stat.f_frsize ? stat.f_frsize : stat.f_bsize) * stat.f_blocks;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}